

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

int stbi__parse_png_file(stbi__png *z,int scan,int req_comp)

{
  stbi__context *s;
  stbi__context *psVar1;
  stbi_uc **ppsVar2;
  byte bVar3;
  byte bVar4;
  stbi_uc sVar5;
  int iVar6;
  stbi__uint32 sVar7;
  stbi__uint32 sVar8;
  uint uVar9;
  int depth;
  int iVar10;
  ulong uVar11;
  size_t __size;
  stbi_uc *psVar12;
  stbi_uc *psVar13;
  uint uVar14;
  ulong uVar15;
  stbi_uc *psVar16;
  uint uVar17;
  long lVar18;
  ushort uVar19;
  uint uVar20;
  long lVar21;
  uint uVar22;
  long lVar23;
  stbi__png *psVar24;
  uint y;
  long lVar25;
  char cVar26;
  ulong uVar27;
  bool bVar28;
  stbi_uc asStack_4c8 [8];
  stbi_uc palette [1024];
  stbi_uc *local_b8;
  stbi__uint32 local_ac;
  uint local_a8;
  stbi__uint32 raw_len;
  ulong local_a0;
  undefined8 local_98;
  stbi_uc *local_90;
  uint local_88;
  stbi__uint32 local_84;
  ulong local_80;
  ulong local_78;
  undefined8 local_70;
  int local_68;
  uint local_64;
  stbi_uc **local_60;
  stbi__png *local_58;
  ulong local_50;
  ulong local_48;
  long local_40;
  stbi_uc local_33 [8];
  stbi_uc tc [3];
  
  s = z->s;
  z->idata = (stbi_uc *)0x0;
  z->expanded = (stbi_uc *)0x0;
  z->out = (stbi_uc *)0x0;
  iVar6 = stbi__check_png_header(s);
  if (iVar6 == 0) {
    return 0;
  }
  if (scan == 1) {
    return 1;
  }
  local_40 = CONCAT44(local_40._4_4_,scan);
  local_60 = &z->idata;
  bVar28 = true;
  local_70 = (stbi_uc *)((ulong)local_70._4_4_ << 0x20);
  local_a0 = 0;
  local_78 = 0;
  local_68 = 0;
  local_50 = 0;
  uVar9 = 0;
  local_48 = 0;
  local_98 = 0;
  uVar15 = 0;
  local_88 = req_comp;
  local_58 = z;
  do {
    sVar7 = stbi__get32be(s);
    uVar11 = (ulong)sVar7;
    sVar8 = stbi__get32be(s);
    ppsVar2 = local_60;
    if (sVar8 == 0x43674249) {
      local_68 = 1;
LAB_0011c237:
      stbi__skip(s,sVar7);
    }
    else {
      cVar26 = (char)uVar15;
      uVar22 = (uint)local_50;
      uVar14 = (uint)local_48;
      if (sVar8 == 0x49444154) {
        if (bVar28) goto LAB_0011c463;
        if ((cVar26 != '\0') && (uVar22 == 0)) {
          stbi__g_failure_reason = "no PLTE";
          return 0;
        }
        if ((int)local_40 == 2) {
          s->img_n = (uint)uVar15 & 0xff;
          return 1;
        }
        uVar22 = sVar7 + uVar14;
        if ((int)uVar22 < (int)uVar14) {
          return 0;
        }
        if (uVar9 < uVar22) {
          if (sVar7 < 0x1001) {
            uVar11 = 0x1000;
          }
          if (uVar9 != 0) {
            uVar11 = (ulong)uVar9;
          }
          do {
            __size = uVar11;
            uVar9 = (uint)__size;
            uVar11 = (ulong)(uVar9 * 2);
          } while (uVar9 < uVar22);
          local_80 = uVar15;
          psVar12 = (stbi_uc *)realloc(*local_60,__size);
          if (psVar12 == (stbi_uc *)0x0) goto LAB_0011ca4d;
          *ppsVar2 = psVar12;
          uVar14 = (uint)local_48;
        }
        else {
          psVar12 = *local_60;
          local_80 = uVar15;
        }
        iVar6 = stbi__getn(s,psVar12 + uVar14,sVar7);
        if (iVar6 == 0) {
          stbi__g_failure_reason = "outofdata";
          return 0;
        }
        local_48 = (ulong)uVar22;
        uVar11 = local_50;
LAB_0011c388:
        local_50 = uVar11;
        bVar28 = false;
        uVar15 = local_80 & 0xffffffff;
      }
      else if (sVar8 == 0x49484452) {
        if (!bVar28) {
          stbi__g_failure_reason = "multiple IHDR";
          return 0;
        }
        if (sVar7 != 0xd) {
          stbi__g_failure_reason = "bad IHDR len";
          return 0;
        }
        sVar7 = stbi__get32be(s);
        s->img_x = sVar7;
        if (0x1000000 < sVar7) {
LAB_0011c436:
          stbi__g_failure_reason = "too large";
          return 0;
        }
        sVar7 = stbi__get32be(s);
        s->img_y = sVar7;
        if (0x1000000 < sVar7) goto LAB_0011c436;
        bVar3 = stbi__get8(s);
        if ((8 < bVar3) || (local_78 = (ulong)bVar3, (0x116U >> (bVar3 & 0x1f) & 1) == 0)) {
          stbi__g_failure_reason = "1/2/4/8-bit only";
          return 0;
        }
        bVar3 = stbi__get8(s);
        if (6 < bVar3) {
LAB_0011c451:
          stbi__g_failure_reason = "bad ctype";
          return 0;
        }
        uVar11 = CONCAT71((int7)(uVar15 >> 8),3);
        if ((bVar3 != 3) && (uVar11 = uVar15 & 0xffffffff, (bVar3 & 1) != 0)) goto LAB_0011c451;
        uVar15 = uVar11;
        sVar5 = stbi__get8(s);
        if (sVar5 != '\0') {
          stbi__g_failure_reason = "bad comp method";
          return 0;
        }
        sVar5 = stbi__get8(s);
        if (sVar5 != '\0') {
          stbi__g_failure_reason = "bad filter method";
          return 0;
        }
        bVar4 = stbi__get8(s);
        if (1 < bVar4) {
          stbi__g_failure_reason = "bad interlace method";
          return 0;
        }
        uVar22 = s->img_x;
        if ((uVar22 == 0) || (uVar14 = s->img_y, uVar14 == 0)) {
          stbi__g_failure_reason = "0-pixel image";
          return 0;
        }
        local_70 = (stbi_uc *)CONCAT44(local_70._4_4_,(uint)bVar4);
        local_a0 = (ulong)bVar3;
        if ((char)uVar15 == '\0') {
          uVar17 = (uint)(3 < bVar3) + (bVar3 & 2) + 1;
          s->img_n = uVar17;
          if ((uint)((0x40000000 / (ulong)uVar22) / (ulong)uVar17) < uVar14) goto LAB_0011c436;
          bVar28 = false;
          uVar15 = 0;
          if ((int)local_40 == 2) {
            return 1;
          }
        }
        else {
          s->img_n = 1;
          bVar28 = false;
          if ((uint)(0x40000000 / (ulong)uVar22 >> 2) < uVar14) goto LAB_0011c436;
        }
      }
      else {
        if (sVar8 == 0x504c5445) {
          if (bVar28) goto LAB_0011c463;
          if ((0x300 < sVar7) ||
             (uVar22 = (sVar7 & 0xffff) / 3, uVar11 = (ulong)(ushort)uVar22, uVar22 * 3 != sVar7)) {
            stbi__g_failure_reason = "invalid PLTE";
            return 0;
          }
          local_80 = uVar15;
          for (uVar27 = 0; uVar11 != uVar27; uVar27 = uVar27 + 1) {
            sVar5 = stbi__get8(s);
            asStack_4c8[uVar27 * 4] = sVar5;
            sVar5 = stbi__get8(s);
            asStack_4c8[uVar27 * 4 + 1] = sVar5;
            sVar5 = stbi__get8(s);
            asStack_4c8[uVar27 * 4 + 2] = sVar5;
            asStack_4c8[uVar27 * 4 + 3] = 0xff;
          }
          goto LAB_0011c388;
        }
        if (sVar8 != 0x74524e53) {
          if (sVar8 != 0x49454e44) {
            if (bVar28) goto LAB_0011c463;
            bVar28 = false;
            if ((sVar8 >> 0x1d & 1) == 0) {
              uVar9 = sVar8 >> 0x18 | (sVar8 & 0xff0000) >> 8 | (sVar8 & 0xff00) << 8 |
                      sVar8 << 0x18;
              stbi__g_failure_reason = stbi__parse_png_file::invalid_chunk;
              stbi__parse_png_file::invalid_chunk[0] = (char)uVar9;
              stbi__parse_png_file::invalid_chunk[1] = (char)(uVar9 >> 8);
              stbi__parse_png_file::invalid_chunk[2] = (char)(uVar9 >> 0x10);
              stbi__parse_png_file::invalid_chunk[3] = (char)(uVar9 >> 0x18);
              return 0;
            }
            goto LAB_0011c237;
          }
          if (bVar28) {
LAB_0011c463:
            stbi__g_failure_reason = "first not IHDR";
            return 0;
          }
          if ((int)local_40 != 0) {
            return 1;
          }
          if (*local_60 == (stbi_uc *)0x0) {
            stbi__g_failure_reason = "no IDAT";
            return 0;
          }
          local_ac = s->img_n * s->img_y * (s->img_x * (int)local_78 + 7 >> 3) + s->img_y;
          psVar12 = (stbi_uc *)
                    stbi_zlib_decode_malloc_guesssize_headerflag
                              ((char *)*local_60,uVar14,local_ac,(int *)&local_ac,
                               (uint)(local_68 == 0));
          psVar24 = local_58;
          local_58->expanded = psVar12;
          if (psVar12 == (stbi_uc *)0x0) {
            return 0;
          }
          free(local_58->idata);
          psVar24->idata = (stbi_uc *)0x0;
          uVar9 = s->img_n + 1;
          uVar22 = s->img_n;
          if ((char)local_98 != '\0') {
            uVar22 = uVar9;
          }
          uVar14 = uVar22;
          if (local_88 != 3) {
            uVar14 = uVar9;
          }
          if (cVar26 != '\0') {
            uVar14 = uVar22;
          }
          if (uVar9 != local_88) {
            uVar14 = uVar22;
          }
          s->img_out_n = uVar14;
          local_b8 = psVar24->expanded;
          sVar7 = psVar24->s->img_x;
          sVar8 = psVar24->s->img_y;
          if ((int)local_70 == 0) {
            iVar6 = stbi__create_png_image_raw
                              (psVar24,local_b8,local_ac,uVar14,sVar7,sVar8,(int)local_78,
                               (int)local_a0);
            if (iVar6 == 0) {
              return 0;
            }
          }
          else {
            local_84 = local_ac;
            local_90 = (stbi_uc *)malloc((ulong)(sVar7 * uVar14 * sVar8));
            local_60 = (stbi_uc **)(long)(int)uVar14;
            raw_len = uVar14;
            local_80 = uVar15;
            for (lVar21 = 0; sVar7 = raw_len, lVar21 != 7; lVar21 = lVar21 + 1) {
              psVar1 = psVar24->s;
              local_70 = (stbi_uc *)(long)(int)(&DAT_00129310)[lVar21];
              uVar9 = (&DAT_00129350)[lVar21];
              local_48 = (ulong)(int)uVar9;
              uVar20 = ~(&DAT_00129310)[lVar21] + psVar1->img_x + uVar9;
              uVar17 = uVar20 / uVar9;
              local_50 = CONCAT44(local_50._4_4_,(&DAT_00129330)[lVar21]);
              uVar22 = (&DAT_00129370)[lVar21];
              uVar14 = ~(&DAT_00129330)[lVar21] + psVar1->img_y + uVar22;
              y = uVar14 / uVar22;
              if ((uVar9 <= uVar20) && (local_64 = uVar22, uVar22 <= uVar14)) {
                depth = (int)local_78;
                iVar6 = psVar1->img_n;
                local_40 = CONCAT44(local_40._4_4_,uVar17);
                iVar10 = stbi__create_png_image_raw
                                   (psVar24,local_b8,local_84,raw_len,uVar17,y,depth,(int)local_a0);
                if (iVar10 == 0) {
                  free(local_90);
                  return 0;
                }
                local_a8 = (((int)(uVar17 * depth * iVar6 + 7) >> 3) + 1) * y;
                lVar23 = (long)(int)local_40;
                palette._1016_8_ = SEXT48((int)y);
                local_50 = CONCAT44(local_50._4_4_,(int)local_50 * sVar7);
                local_64 = local_64 * sVar7;
                local_70 = local_90 + (long)local_70 * (long)local_60;
                local_48 = local_48 * (long)local_60;
                lVar18 = 0;
                while (psVar24 = local_58, lVar18 < (long)palette._1016_8_) {
                  psVar12 = local_70;
                  local_40 = lVar18;
                  for (lVar25 = 0; lVar25 < lVar23; lVar25 = lVar25 + 1) {
                    memcpy(psVar12 + local_58->s->img_x * (int)local_50,
                           local_58->out + (lVar18 * lVar23 + lVar25) * (long)local_60,
                           (size_t)local_60);
                    psVar12 = psVar12 + local_48;
                  }
                  local_50 = CONCAT44(local_50._4_4_,(int)local_50 + local_64);
                  uVar15 = local_80;
                  lVar18 = local_40 + 1;
                }
                free(local_58->out);
                local_b8 = local_b8 + local_a8;
                local_84 = local_84 - local_a8;
              }
            }
            psVar24->out = local_90;
          }
          if ((char)local_98 != '\0') {
            psVar12 = psVar24->out;
            iVar6 = psVar24->s->img_y * psVar24->s->img_x;
            if (s->img_out_n == 4) {
              for (lVar21 = 0; iVar6 != (int)lVar21; lVar21 = lVar21 + 1) {
                if (((psVar12[lVar21 * 4] == local_33[0]) &&
                    (psVar12[lVar21 * 4 + 1] == local_33[1])) &&
                   (psVar12[lVar21 * 4 + 2] == local_33[2])) {
                  psVar12[lVar21 * 4 + 3] = '\0';
                }
              }
            }
            else {
              if (s->img_out_n != 2) {
                __assert_fail("out_n == 2 || out_n == 4",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/3rdparty/stb_image.h"
                              ,0x1059,"int stbi__compute_transparency(stbi__png *, stbi_uc *, int)")
                ;
              }
              for (lVar21 = 0; iVar6 != (int)lVar21; lVar21 = lVar21 + 1) {
                psVar12[lVar21 * 2 + 1] = -(psVar12[lVar21 * 2] != local_33[0]);
              }
            }
          }
          if (((local_68 != 0) && (stbi__de_iphone_flag != 0)) && (2 < s->img_out_n)) {
            psVar1 = psVar24->s;
            psVar12 = psVar24->out;
            iVar6 = psVar1->img_y * psVar1->img_x;
            psVar24 = local_58;
            if (psVar1->img_out_n == 4) {
              if (stbi__unpremultiply_on_load == 0) {
                for (lVar21 = 0; iVar6 != (int)lVar21; lVar21 = lVar21 + 1) {
                  sVar5 = psVar12[lVar21 * 4];
                  psVar12[lVar21 * 4] = psVar12[lVar21 * 4 + 2];
                  psVar12[lVar21 * 4 + 2] = sVar5;
                }
              }
              else {
                for (lVar21 = 0; iVar6 != (int)lVar21; lVar21 = lVar21 + 1) {
                  bVar3 = psVar12[lVar21 * 4];
                  bVar4 = psVar12[lVar21 * 4 + 2];
                  if (psVar12[lVar21 * 4 + 3] != 0) {
                    uVar19 = (ushort)psVar12[lVar21 * 4 + 3];
                    bVar4 = (byte)(((uint)bVar4 * 0xff) / (uint)uVar19);
                    psVar12[lVar21 * 4 + 1] =
                         (stbi_uc)(((uint)psVar12[lVar21 * 4 + 1] * 0xff) / (uint)uVar19);
                    bVar3 = (byte)((ushort)((ushort)bVar3 * 0xff) / uVar19);
                  }
                  psVar12[lVar21 * 4] = bVar4;
                  psVar12[lVar21 * 4 + 2] = bVar3;
                }
              }
            }
            else {
              if (psVar1->img_out_n != 3) {
                __assert_fail("s->img_out_n == 4",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/3rdparty/stb_image.h"
                              ,0x10aa,"void stbi__de_iphone(stbi__png *)");
              }
              while (bVar28 = iVar6 != 0, iVar6 = iVar6 + -1, bVar28) {
                sVar5 = *psVar12;
                *psVar12 = psVar12[2];
                psVar12[2] = sVar5;
                psVar12 = psVar12 + 3;
              }
            }
          }
          if ((char)uVar15 != '\0') {
            uVar9 = (uint)uVar15 & 0xff;
            s->img_n = uVar9;
            if (2 < (int)local_88) {
              uVar9 = local_88;
            }
            s->img_out_n = uVar9;
            psVar12 = psVar24->out;
            uVar22 = psVar24->s->img_y * psVar24->s->img_x;
            psVar13 = (stbi_uc *)malloc((ulong)(uVar22 * uVar9));
            psVar24 = local_58;
            if (psVar13 == (stbi_uc *)0x0) {
LAB_0011ca4d:
              stbi__g_failure_reason = "outofmem";
              return 0;
            }
            uVar15 = 0;
            psVar16 = psVar13;
            if (uVar9 == 3) {
              for (; uVar22 != uVar15; uVar15 = uVar15 + 1) {
                uVar11 = (ulong)psVar12[uVar15];
                *psVar16 = asStack_4c8[uVar11 * 4];
                psVar16[1] = asStack_4c8[uVar11 * 4 + 1];
                psVar16[2] = asStack_4c8[uVar11 * 4 + 2];
                psVar16 = psVar16 + 3;
              }
            }
            else {
              for (; uVar22 != uVar15; uVar15 = uVar15 + 1) {
                uVar11 = (ulong)psVar12[uVar15];
                psVar13[uVar15 * 4] = asStack_4c8[uVar11 * 4];
                psVar13[uVar15 * 4 + 1] = asStack_4c8[uVar11 * 4 + 1];
                psVar13[uVar15 * 4 + 2] = asStack_4c8[uVar11 * 4 + 2];
                psVar13[uVar15 * 4 + 3] = asStack_4c8[uVar11 * 4 + 3];
              }
            }
            free(psVar12);
            psVar24->out = psVar13;
          }
          free(psVar24->expanded);
          psVar24->expanded = (stbi_uc *)0x0;
          return 1;
        }
        if (bVar28) goto LAB_0011c463;
        if (*local_60 != (stbi_uc *)0x0) {
          stbi__g_failure_reason = "tRNS after IDAT";
          return 0;
        }
        if (cVar26 == '\0') {
          uVar22 = s->img_n;
          if ((uVar22 & 1) == 0) {
            stbi__g_failure_reason = "tRNS with alpha";
            return 0;
          }
          if (uVar22 * 2 != sVar7) {
LAB_0011c4ce:
            stbi__g_failure_reason = "bad tRNS len";
            return 0;
          }
          uVar15 = local_78 & 0xffffffff;
          for (lVar21 = 0; lVar21 < (int)uVar22; lVar21 = lVar21 + 1) {
            iVar6 = stbi__get16be(s);
            local_33[lVar21] = ""[uVar15] * (char)iVar6;
            uVar22 = s->img_n;
          }
          local_98 = CONCAT71((int7)(int3)(uVar22 >> 8),1);
          bVar28 = false;
          uVar15 = 0;
        }
        else {
          if ((int)local_40 == 2) {
            s->img_n = 4;
            return 1;
          }
          if (uVar22 == 0) {
            stbi__g_failure_reason = "tRNS before PLTE";
            return 0;
          }
          if (uVar22 < sVar7) goto LAB_0011c4ce;
          for (uVar15 = 0; uVar11 != uVar15; uVar15 = uVar15 + 1) {
            sVar5 = stbi__get8(s);
            asStack_4c8[uVar15 * 4 + 3] = sVar5;
          }
          uVar15 = CONCAT71((int7)(uVar15 >> 8),4);
          bVar28 = false;
        }
      }
    }
    stbi__get32be(s);
  } while( true );
}

Assistant:

static int stbi__parse_png_file(stbi__png *z, int scan, int req_comp)
{
   stbi_uc palette[1024], pal_img_n=0;
   stbi_uc has_trans=0, tc[3];
   stbi__uint32 ioff=0, idata_limit=0, i, pal_len=0;
   int first=1,k,interlace=0, color=0, depth=0, is_iphone=0;
   stbi__context *s = z->s;

   z->expanded = NULL;
   z->idata = NULL;
   z->out = NULL;

   if (!stbi__check_png_header(s)) return 0;

   if (scan == STBI__SCAN_type) return 1;

   for (;;) {
      stbi__pngchunk c = stbi__get_chunk_header(s);
      switch (c.type) {
         case STBI__PNG_TYPE('C','g','B','I'):
            is_iphone = 1;
            stbi__skip(s, c.length);
            break;
         case STBI__PNG_TYPE('I','H','D','R'): {
            int comp,filter;
            if (!first) return stbi__err("multiple IHDR","Corrupt PNG");
            first = 0;
            if (c.length != 13) return stbi__err("bad IHDR len","Corrupt PNG");
            s->img_x = stbi__get32be(s); if (s->img_x > (1 << 24)) return stbi__err("too large","Very large image (corrupt?)");
            s->img_y = stbi__get32be(s); if (s->img_y > (1 << 24)) return stbi__err("too large","Very large image (corrupt?)");
            depth = stbi__get8(s);  if (depth != 1 && depth != 2 && depth != 4 && depth != 8)  return stbi__err("1/2/4/8-bit only","PNG not supported: 1/2/4/8-bit only");
            color = stbi__get8(s);  if (color > 6)         return stbi__err("bad ctype","Corrupt PNG");
            if (color == 3) pal_img_n = 3; else if (color & 1) return stbi__err("bad ctype","Corrupt PNG");
            comp  = stbi__get8(s);  if (comp) return stbi__err("bad comp method","Corrupt PNG");
            filter= stbi__get8(s);  if (filter) return stbi__err("bad filter method","Corrupt PNG");
            interlace = stbi__get8(s); if (interlace>1) return stbi__err("bad interlace method","Corrupt PNG");
            if (!s->img_x || !s->img_y) return stbi__err("0-pixel image","Corrupt PNG");
            if (!pal_img_n) {
               s->img_n = (color & 2 ? 3 : 1) + (color & 4 ? 1 : 0);
               if ((1 << 30) / s->img_x / s->img_n < s->img_y) return stbi__err("too large", "Image too large to decode");
               if (scan == STBI__SCAN_header) return 1;
            } else {
               // if paletted, then pal_n is our final components, and
               // img_n is # components to decompress/filter.
               s->img_n = 1;
               if ((1 << 30) / s->img_x / 4 < s->img_y) return stbi__err("too large","Corrupt PNG");
               // if SCAN_header, have to scan to see if we have a tRNS
            }
            break;
         }

         case STBI__PNG_TYPE('P','L','T','E'):  {
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (c.length > 256*3) return stbi__err("invalid PLTE","Corrupt PNG");
            pal_len = c.length / 3;
            if (pal_len * 3 != c.length) return stbi__err("invalid PLTE","Corrupt PNG");
            for (i=0; i < pal_len; ++i) {
               palette[i*4+0] = stbi__get8(s);
               palette[i*4+1] = stbi__get8(s);
               palette[i*4+2] = stbi__get8(s);
               palette[i*4+3] = 255;
            }
            break;
         }

         case STBI__PNG_TYPE('t','R','N','S'): {
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (z->idata) return stbi__err("tRNS after IDAT","Corrupt PNG");
            if (pal_img_n) {
               if (scan == STBI__SCAN_header) { s->img_n = 4; return 1; }
               if (pal_len == 0) return stbi__err("tRNS before PLTE","Corrupt PNG");
               if (c.length > pal_len) return stbi__err("bad tRNS len","Corrupt PNG");
               pal_img_n = 4;
               for (i=0; i < c.length; ++i)
                  palette[i*4+3] = stbi__get8(s);
            } else {
               if (!(s->img_n & 1)) return stbi__err("tRNS with alpha","Corrupt PNG");
               if (c.length != (stbi__uint32) s->img_n*2) return stbi__err("bad tRNS len","Corrupt PNG");
               has_trans = 1;
               for (k=0; k < s->img_n; ++k)
                  tc[k] = (stbi_uc) (stbi__get16be(s) & 255) * stbi__depth_scale_table[depth]; // non 8-bit images will be larger
            }
            break;
         }

         case STBI__PNG_TYPE('I','D','A','T'): {
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (pal_img_n && !pal_len) return stbi__err("no PLTE","Corrupt PNG");
            if (scan == STBI__SCAN_header) { s->img_n = pal_img_n; return 1; }
            if ((int)(ioff + c.length) < (int)ioff) return 0;
            if (ioff + c.length > idata_limit) {
               stbi_uc *p;
               if (idata_limit == 0) idata_limit = c.length > 4096 ? c.length : 4096;
               while (ioff + c.length > idata_limit)
                  idata_limit *= 2;
               p = (stbi_uc *) STBI_REALLOC(z->idata, idata_limit); if (p == NULL) return stbi__err("outofmem", "Out of memory");
               z->idata = p;
            }
            if (!stbi__getn(s, z->idata+ioff,c.length)) return stbi__err("outofdata","Corrupt PNG");
            ioff += c.length;
            break;
         }

         case STBI__PNG_TYPE('I','E','N','D'): {
            stbi__uint32 raw_len, bpl;
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (scan != STBI__SCAN_load) return 1;
            if (z->idata == NULL) return stbi__err("no IDAT","Corrupt PNG");
            // initial guess for decoded data size to avoid unnecessary reallocs
            bpl = (s->img_x * depth + 7) / 8; // bytes per line, per component
            raw_len = bpl * s->img_y * s->img_n /* pixels */ + s->img_y /* filter mode per row */;
            z->expanded = (stbi_uc *) stbi_zlib_decode_malloc_guesssize_headerflag((char *) z->idata, ioff, raw_len, (int *) &raw_len, !is_iphone);
            if (z->expanded == NULL) return 0; // zlib should set error
            STBI_FREE(z->idata); z->idata = NULL;
            if ((req_comp == s->img_n+1 && req_comp != 3 && !pal_img_n) || has_trans)
               s->img_out_n = s->img_n+1;
            else
               s->img_out_n = s->img_n;
            if (!stbi__create_png_image(z, z->expanded, raw_len, s->img_out_n, depth, color, interlace)) return 0;
            if (has_trans)
               if (!stbi__compute_transparency(z, tc, s->img_out_n)) return 0;
            if (is_iphone && stbi__de_iphone_flag && s->img_out_n > 2)
               stbi__de_iphone(z);
            if (pal_img_n) {
               // pal_img_n == 3 or 4
               s->img_n = pal_img_n; // record the actual colors we had
               s->img_out_n = pal_img_n;
               if (req_comp >= 3) s->img_out_n = req_comp;
               if (!stbi__expand_png_palette(z, palette, pal_len, s->img_out_n))
                  return 0;
            }
            STBI_FREE(z->expanded); z->expanded = NULL;
            return 1;
         }

         default:
            // if critical, fail
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if ((c.type & (1 << 29)) == 0) {
               #ifndef STBI_NO_FAILURE_STRINGS
               // not threadsafe
               static char invalid_chunk[] = "XXXX PNG chunk not known";
               invalid_chunk[0] = STBI__BYTECAST(c.type >> 24);
               invalid_chunk[1] = STBI__BYTECAST(c.type >> 16);
               invalid_chunk[2] = STBI__BYTECAST(c.type >>  8);
               invalid_chunk[3] = STBI__BYTECAST(c.type >>  0);
               #endif
               return stbi__err(invalid_chunk, "PNG not supported: unknown PNG chunk type");
            }
            stbi__skip(s, c.length);
            break;
      }
      // end of PNG chunk, read and skip CRC
      stbi__get32be(s);
   }
}